

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report.cpp
# Opt level: O2

void __thiscall
sc_core::sc_report::sc_report
          (sc_report *this,sc_severity severity_,sc_msg_def *md_,char *msg_,char *file_,int line_,
          int verbosity_level)

{
  char *pcVar1;
  sc_time *psVar2;
  sc_time *psVar3;
  sc_report *rep;
  string local_40;
  
  *(undefined ***)this = &PTR__sc_report_00265e70;
  this->severity = severity_;
  this->md = md_;
  pcVar1 = empty_dup(msg_);
  this->msg = pcVar1;
  pcVar1 = empty_dup(file_);
  this->file = pcVar1;
  this->line = line_;
  psVar2 = (sc_time *)operator_new(8);
  psVar3 = sc_time_stamp();
  psVar2->m_value = psVar3->m_value;
  this->timestamp = psVar2;
  pcVar1 = sc_get_current_process_name((char *)0x0);
  pcVar1 = empty_dup(pcVar1);
  this->process_name = pcVar1;
  this->m_verbosity_level = verbosity_level;
  sc_report_compose_message_abi_cxx11_(&local_40,(sc_core *)this,rep);
  pcVar1 = empty_dup(local_40._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  this->m_what = pcVar1;
  return;
}

Assistant:

sc_report::sc_report(sc_severity severity_,
		     const sc_msg_def* md_,
		     const char* msg_,
		     const char* file_,
		     int line_,
		     int verbosity_level)
: severity(severity_),
  md(md_),
  msg(empty_dup(msg_)),
  file(empty_dup(file_)),
  line(line_),
  timestamp(new sc_time(sc_time_stamp())),
  process_name(empty_dup(sc_get_current_process_name())),
  m_verbosity_level(verbosity_level),
  m_what( empty_dup( sc_report_compose_message(*this).c_str() ) )
{
}